

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O0

void slang::mul(uint64_t *dst,uint64_t *x,uint32_t xlen,uint64_t *y,uint32_t ylen)

{
  uint64_t uVar1;
  uint8_t c;
  calc_out_t result;
  uint64_t uStack_58;
  uint32_t j;
  uint64_t carry;
  uint32_t i;
  uint32_t ylen_local;
  uint64_t *y_local;
  uint64_t *puStack_38;
  uint32_t xlen_local;
  uint64_t *x_local;
  uint64_t *dst_local;
  ulong local_20;
  uint64_t local_18;
  undefined1 local_9;
  
  carry._4_4_ = ylen;
  _i = y;
  y_local._4_4_ = xlen;
  puStack_38 = x;
  x_local = dst;
  if ((xlen < 8) || (ylen < 8)) {
    uVar1 = mulOne(dst,x,xlen,*y);
    x_local[y_local._4_4_] = uVar1;
    for (carry._0_4_ = 1; (uint)carry < carry._4_4_; carry._0_4_ = (uint)carry + 1) {
      uStack_58 = 0;
      for (result._4_4_ = 0; result._4_4_ < y_local._4_4_; result._4_4_ = result._4_4_ + 1) {
        local_18 = mulTerm(puStack_38[result._4_4_],_i[(uint)carry],&stack0xffffffffffffffa8);
        local_20 = x_local[(uint)carry + result._4_4_];
        local_9 = 0;
        dst_local = (uint64_t *)&stack0xffffffffffffff98;
        x_local[(uint)carry + result._4_4_] = local_18 + local_20;
        uStack_58 = CARRY8(local_18,local_20) + uStack_58;
      }
      x_local[(uint)carry + y_local._4_4_] = uStack_58;
    }
  }
  else {
    mulKaratsuba(dst,x,xlen,y,ylen);
  }
  return;
}

Assistant:

static void mul(uint64_t* dst, const uint64_t* x, uint32_t xlen, const uint64_t* y, uint32_t ylen) {
    if (xlen > 7 && ylen > 7) {
        mulKaratsuba(dst, x, xlen, y, ylen);
        return;
    }

    dst[xlen] = mulOne(dst, x, xlen, y[0]);
    for (uint32_t i = 1; i < ylen; i++) {
        uint64_t carry = 0;
        for (uint32_t j = 0; j < xlen; j++) {
            calc_out_t result;
            uint8_t c = addcarry64(0, mulTerm(x[j], y[i], carry), dst[i + j], &result);

            dst[i + j] = result;
            carry += c;
        }
        dst[i + xlen] = carry;
    }
}